

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestCanonicalizeFile::Run(ParserTestCanonicalizeFile *this)

{
  Test *pTVar1;
  int iVar2;
  int iVar3;
  Node *pNVar4;
  StringPiece local_58;
  StringPiece local_48;
  StringPiece local_38;
  StringPiece local_28;
  int local_14;
  ParserTestCanonicalizeFile *pPStack_10;
  int fail_count;
  ParserTestCanonicalizeFile *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild out: cat in/1 in//2\nbuild in/1: cat\nbuild in/2: cat\n"
            );
  iVar2 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar3) {
    StringPiece::StringPiece(&local_28,"in/1");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_28);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x100,"state.LookupNode(\"in/1\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_38,"in/2");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_38);
    testing::Test::Check
              (pTVar1,pNVar4 != (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x101,"state.LookupNode(\"in/2\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_48,"in//1");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_48);
    testing::Test::Check
              (pTVar1,(bool)((pNVar4 != (Node *)0x0 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x102,"state.LookupNode(\"in//1\")");
    pTVar1 = g_current_test;
    StringPiece::StringPiece(&local_58,"in//2");
    pNVar4 = State::LookupNode(&(this->super_ParserTest).state,local_58);
    testing::Test::Check
              (pTVar1,(bool)((pNVar4 != (Node *)0x0 ^ 0xffU) & 1),
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/manifest_parser_test.cc"
               ,0x103,"state.LookupNode(\"in//2\")");
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, CanonicalizeFile) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build out: cat in/1 in//2\n"
"build in/1: cat\n"
"build in/2: cat\n"));

  EXPECT_TRUE(state.LookupNode("in/1"));
  EXPECT_TRUE(state.LookupNode("in/2"));
  EXPECT_FALSE(state.LookupNode("in//1"));
  EXPECT_FALSE(state.LookupNode("in//2"));
}